

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dthinker.cpp
# Opt level: O0

void DThinker::DestroyThinkersInList(FThinkerList *list)

{
  DThinker *local_18;
  DThinker *node;
  FThinkerList *list_local;
  
  if (list->Sentinel != (DThinker *)0x0) {
    local_18 = list->Sentinel->NextThinker;
    while (local_18 != list->Sentinel) {
      if (local_18 == (DThinker *)0x0) {
        __assert_fail("node != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dthinker.cpp"
                      ,0x1be,"static void DThinker::DestroyThinkersInList(FThinkerList &)");
      }
      (*(local_18->super_DObject)._vptr_DObject[4])();
      local_18 = list->Sentinel->NextThinker;
    }
    (*(list->Sentinel->super_DObject)._vptr_DObject[4])();
    list->Sentinel = (DThinker *)0x0;
  }
  return;
}

Assistant:

void DThinker::DestroyThinkersInList (FThinkerList &list)
{
	if (list.Sentinel != NULL)
	{
		for (DThinker *node = list.Sentinel->NextThinker; node != list.Sentinel; node = list.Sentinel->NextThinker)
		{
			assert(node != NULL);
			node->Destroy();
		}
		list.Sentinel->Destroy();
		list.Sentinel = NULL;
	}
}